

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O0

void Jf_ObjComputeBestCut(Jf_Man_t *p,Gia_Obj_t *pObj,int fEdge,int fEla)

{
  int i_00;
  int iVar1;
  int *pCuts_00;
  float fVar2;
  float local_5c;
  float local_50;
  float AreaBest;
  float Area;
  int TimeBest;
  int Time;
  int *pCutBest;
  int *pCut;
  int *pCuts;
  int iObj;
  int i;
  int fEla_local;
  int fEdge_local;
  Gia_Obj_t *pObj_local;
  Jf_Man_t *p_local;
  
  i_00 = Gia_ObjId(p->pGia,pObj);
  pCuts_00 = Jf_ObjCuts(p,i_00);
  _TimeBest = (int *)0x0;
  Area = 0.0047237873;
  AreaBest = 0.0047237873;
  local_50 = 1e+09;
  pCuts._4_4_ = 0;
  pCutBest = pCuts_00 + 1;
  while (pCuts._4_4_ < *pCuts_00) {
    iVar1 = Jf_CutIsTriv(pCutBest,i_00);
    if (iVar1 == 0) {
      if ((fEdge != 0) && (fEla == 0)) {
        iVar1 = Jf_CutSize(pCutBest);
        Jf_CutSetCost(pCutBest,iVar1);
      }
      if (fEla == 0) {
        local_5c = Jf_CutFlow(p,pCutBest);
        iVar1 = Jf_CutCost(pCutBest);
        local_5c = local_5c + (float)iVar1;
      }
      else {
        iVar1 = Jf_CutArea(p,pCutBest,fEdge);
        local_5c = (float)iVar1;
      }
      if (((_TimeBest == (int *)0x0) || (local_5c + 0.005 < local_50)) ||
         ((local_5c - 0.005 < local_50 &&
          (Area = (float)Jf_CutArr(p,pCutBest), (int)Area < (int)AreaBest)))) {
        _TimeBest = pCutBest;
        local_50 = local_5c;
        AreaBest = Area;
      }
    }
    pCuts._4_4_ = pCuts._4_4_ + 1;
    iVar1 = Jf_CutSize(pCutBest);
    pCutBest = pCutBest + (iVar1 + 1);
  }
  iVar1 = Jf_CutArr(p,_TimeBest);
  Vec_IntWriteEntry(&p->vArr,i_00,iVar1);
  if (fEla == 0) {
    fVar2 = Jf_ObjRefs(p,i_00);
    Vec_FltWriteEntry(&p->vFlow,i_00,local_50 / fVar2);
  }
  Jf_ObjSetBestCut(pCuts_00,_TimeBest,p->vTemp);
  return;
}

Assistant:

void Jf_ObjComputeBestCut( Jf_Man_t * p, Gia_Obj_t * pObj, int fEdge, int fEla )
{
    int i, iObj = Gia_ObjId( p->pGia, pObj );
    int * pCuts = Jf_ObjCuts( p, iObj );
    int * pCut, * pCutBest = NULL;
    int Time = ABC_INFINITY, TimeBest = ABC_INFINITY;
    float Area, AreaBest = ABC_INFINITY;
    Jf_ObjForEachCut( pCuts, pCut, i )
    {
        if ( Jf_CutIsTriv(pCut, iObj) ) continue;
        if ( fEdge && !fEla ) 
            Jf_CutSetCost(pCut, Jf_CutSize(pCut));
        Area = fEla ? Jf_CutArea(p, pCut, fEdge) : Jf_CutFlow(p, pCut) + Jf_CutCost(pCut);
        if ( pCutBest == NULL || AreaBest > Area + JF_EPSILON || (AreaBest > Area - JF_EPSILON && TimeBest > (Time = Jf_CutArr(p, pCut))) )
            pCutBest = pCut, AreaBest = Area, TimeBest = Time;
    }
    Vec_IntWriteEntry( &p->vArr,  iObj, Jf_CutArr(p, pCutBest) );
    if ( !fEla )
    Vec_FltWriteEntry( &p->vFlow, iObj, AreaBest / Jf_ObjRefs(p, iObj) );
    Jf_ObjSetBestCut( pCuts, pCutBest, p->vTemp );
//    Jf_CutPrint( Jf_ObjCutBest(p, iObj) ); printf( "\n" );
}